

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O2

void __thiscall
tcu::CaseListFilter::CaseListFilter(CaseListFilter *this,CommandLine *cmdLine,Archive *archive)

{
  PtrData<const_tcu::CasePaths,_de::DefaultDeleter<const_tcu::CasePaths>_> data;
  bool bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  ValueType *pVVar5;
  CaseTreeNode *pCVar6;
  ValueType *pVVar7;
  ValueType *pVVar8;
  undefined4 extraout_var;
  ValueType *pVVar9;
  CasePaths *this_00;
  ValueType *pathList;
  Exception *pEVar10;
  CasePaths *pCStack_288;
  vector<char,_std::allocator<char>_> buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  UniquePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> caseListResource;
  istringstream str;
  int aiStack_210 [122];
  
  this->m_caseTree = (CaseTreeNode *)0x0;
  (this->m_casePaths).
  super_UniqueBase<const_tcu::CasePaths,_de::DefaultDeleter<const_tcu::CasePaths>_>.m_data.ptr =
       (CasePaths *)0x0;
  bVar1 = de::cmdline::detail::TypedFieldMap::contains<tcu::opt::CaseList>(&cmdLine->m_options);
  if (bVar1) {
    pVVar5 = de::cmdline::detail::TypedFieldMap::get<tcu::opt::CaseList>(&cmdLine->m_options);
    std::__cxx11::istringstream::istringstream((istringstream *)&str,(string *)pVVar5,_S_in);
    pCVar6 = parseCaseList((istream *)&str);
    this->m_caseTree = pCVar6;
    std::__cxx11::istringstream::~istringstream((istringstream *)&str);
  }
  else {
    bVar1 = de::cmdline::detail::TypedFieldMap::contains<tcu::opt::CaseListFile>
                      (&cmdLine->m_options);
    if (bVar1) {
      pVVar7 = de::cmdline::detail::TypedFieldMap::get<tcu::opt::CaseListFile>(&cmdLine->m_options);
      std::ifstream::ifstream(&str,(pVVar7->_M_dataplus)._M_p,_S_bin);
      cVar2 = std::__basic_file<char>::is_open();
      if ((cVar2 == '\0') || (*(int *)((long)aiStack_210 + *(long *)(_str + -0x18)) != 0)) {
        pEVar10 = (Exception *)__cxa_allocate_exception(0x30);
        pVVar7 = de::cmdline::detail::TypedFieldMap::get<tcu::opt::CaseListFile>
                           (&cmdLine->m_options);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buffer,
                       "Failed to open case list file \'",pVVar7);
        std::operator+(&local_260,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buffer,
                       "\'");
        Exception::Exception(pEVar10,&local_260);
        __cxa_throw(pEVar10,&Exception::typeinfo,Exception::~Exception);
      }
      pCVar6 = parseCaseList((istream *)&str);
      this->m_caseTree = pCVar6;
      std::ifstream::~ifstream(&str);
    }
    else {
      bVar1 = de::cmdline::detail::TypedFieldMap::contains<tcu::opt::CaseListResource>
                        (&cmdLine->m_options);
      if (bVar1) {
        pVVar8 = de::cmdline::detail::TypedFieldMap::get<tcu::opt::CaseListResource>
                           (&cmdLine->m_options);
        iVar3 = (*archive->_vptr_Archive[2])(archive,(pVVar8->_M_dataplus)._M_p);
        caseListResource.super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.m_data.
        ptr = (Resource *)CONCAT44(extraout_var,iVar3);
        uVar4 = (*(caseListResource.
                   super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.m_data.ptr)->
                  _vptr_Resource[3])
                          (caseListResource.
                           super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.
                           m_data.ptr);
        std::vector<char,_std::allocator<char>_>::vector
                  (&buffer,(long)(int)uVar4,(allocator_type *)&str);
        if (buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_start ==
            buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_finish) {
          pEVar10 = (Exception *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&str,"Empty case list resource",(allocator<char> *)&local_260);
          Exception::Exception(pEVar10,(string *)&str);
          __cxa_throw(pEVar10,&Exception::typeinfo,Exception::~Exception);
        }
        (*(caseListResource.super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.
           m_data.ptr)->_vptr_Resource[2])
                  (caseListResource.
                   super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.m_data.ptr,
                   buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,(ulong)uVar4);
        local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_260,
                   buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + (int)uVar4);
        std::__cxx11::istringstream::istringstream((istringstream *)&str,(string *)&local_260,_S_in)
        ;
        std::__cxx11::string::~string((string *)&local_260);
        pCVar6 = parseCaseList((istream *)&str);
        this->m_caseTree = pCVar6;
        std::__cxx11::istringstream::~istringstream((istringstream *)&str);
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  (&buffer.super__Vector_base<char,_std::allocator<char>_>);
        de::details::UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::~UniqueBase
                  (&caseListResource.
                    super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>);
      }
      else {
        pVVar9 = de::cmdline::detail::TypedFieldMap::get<tcu::opt::StdinCaseList>
                           (&cmdLine->m_options);
        if (*pVVar9 == true) {
          pCVar6 = parseCaseList((istream *)&std::cin);
          this->m_caseTree = pCVar6;
        }
        else {
          bVar1 = de::cmdline::detail::TypedFieldMap::contains<tcu::opt::CasePath>
                            (&cmdLine->m_options);
          if (bVar1) {
            this_00 = (CasePaths *)operator_new(0x18);
            pathList = de::cmdline::detail::TypedFieldMap::get<tcu::opt::CasePath>
                                 (&cmdLine->m_options);
            CasePaths::CasePaths(this_00,pathList);
            _str = (pointer)0x0;
            data._8_8_ = buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
            data.ptr = pCStack_288;
            de::details::UniqueBase<const_tcu::CasePaths,_de::DefaultDeleter<const_tcu::CasePaths>_>
            ::assignData(&(this->m_casePaths).
                          super_UniqueBase<const_tcu::CasePaths,_de::DefaultDeleter<const_tcu::CasePaths>_>
                         ,data);
            de::details::UniqueBase<const_tcu::CasePaths,_de::DefaultDeleter<const_tcu::CasePaths>_>
            ::~UniqueBase((UniqueBase<const_tcu::CasePaths,_de::DefaultDeleter<const_tcu::CasePaths>_>
                           *)&str);
          }
        }
      }
    }
  }
  return;
}

Assistant:

CaseListFilter::CaseListFilter (const de::cmdline::CommandLine& cmdLine, const tcu::Archive& archive)
	: m_caseTree(DE_NULL)
{
	if (cmdLine.hasOption<opt::CaseList>())
	{
		std::istringstream str(cmdLine.getOption<opt::CaseList>());

		m_caseTree = parseCaseList(str);
	}
	else if (cmdLine.hasOption<opt::CaseListFile>())
	{
		std::ifstream in(cmdLine.getOption<opt::CaseListFile>().c_str(), std::ios_base::binary);

		if (!in.is_open() || !in.good())
			throw Exception("Failed to open case list file '" + cmdLine.getOption<opt::CaseListFile>() + "'");

		m_caseTree = parseCaseList(in);
	}
	else if (cmdLine.hasOption<opt::CaseListResource>())
	{
		// \todo [2016-11-14 pyry] We are cloning potentially large buffers here. Consider writing
		//						   istream adaptor for tcu::Resource.
		de::UniquePtr<Resource>	caseListResource	(archive.getResource(cmdLine.getOption<opt::CaseListResource>().c_str()));
		const int				bufferSize			= caseListResource->getSize();
		std::vector<char>		buffer				((size_t)bufferSize);

		if (buffer.empty())
			throw Exception("Empty case list resource");

		caseListResource->read(reinterpret_cast<deUint8*>(&buffer[0]), bufferSize);

		{
			std::istringstream	in	(std::string(&buffer[0], (size_t)bufferSize));

			m_caseTree = parseCaseList(in);
		}
	}
	else if (cmdLine.getOption<opt::StdinCaseList>())
	{
		m_caseTree = parseCaseList(std::cin);
	}
	else if (cmdLine.hasOption<opt::CasePath>())
		m_casePaths = de::MovePtr<const CasePaths>(new CasePaths(cmdLine.getOption<opt::CasePath>()));
}